

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_stress_memory(_Bool copy_on_write)

{
  undefined4 uVar1;
  roaring_bitmap_t *r;
  size_t sVar2;
  undefined1 in_DIL;
  roaring_bitmap_t *unaff_retaddr;
  roaring_bitmap_t *t;
  size_t actualsize;
  char *serializedbytes;
  uint32_t compact_size;
  uint32_t j;
  size_t k;
  roaring_bitmap_t *r1;
  size_t i;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  roaring_bitmap_t *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  undefined8 local_20;
  undefined8 local_10;
  undefined3 in_stack_fffffffffffffffc;
  uint val;
  
  val = CONCAT13(in_DIL,in_stack_fffffffffffffffc) & 0x1ffffff;
  for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
    r = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(r,(_Bool)((byte)(val >> 0x18) & 1));
    _assert_true((unsigned_long)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    for (local_20 = 0; local_20 < 1000000; local_20 = local_20 + 1) {
      in_stack_ffffffffffffffdc = rand();
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc % 100000000;
      roaring_bitmap_add(unaff_retaddr,val);
    }
    roaring_bitmap_run_optimize(in_stack_ffffffffffffffd0);
    sVar2 = roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x1043e3);
    uVar1 = (undefined4)sVar2;
    in_stack_ffffffffffffffd0 = (roaring_bitmap_t *)malloc(sVar2 & 0xffffffff);
    in_stack_ffffffffffffffc8 =
         (char *)roaring_bitmap_portable_serialize
                           (in_stack_ffffffffffffffc0,
                            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    _assert_int_equal((unsigned_long)in_stack_ffffffffffffffd0,
                      (unsigned_long)in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffc0 = roaring_bitmap_portable_deserialize((char *)0x104431);
    roaring_bitmap_equals
              ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffffdc,uVar1),
               in_stack_ffffffffffffffd0);
    _assert_true((unsigned_long)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    roaring_bitmap_free((roaring_bitmap_t *)0x10446e);
    free(in_stack_ffffffffffffffd0);
    roaring_bitmap_free((roaring_bitmap_t *)0x104482);
  }
  return;
}

Assistant:

void test_stress_memory(bool copy_on_write) {
    for (size_t i = 0; i < 5; i++) {
        roaring_bitmap_t *r1 = roaring_bitmap_create();
        roaring_bitmap_set_copy_on_write(r1, copy_on_write);
        assert_non_null(r1);
        for (size_t k = 0; k < 1000000; k++) {
            uint32_t j = rand() % (100000000);
            roaring_bitmap_add(r1, j);
        }
        roaring_bitmap_run_optimize(r1);
        uint32_t compact_size = roaring_bitmap_portable_size_in_bytes(r1);
        char *serializedbytes = (char *)malloc(compact_size);
        size_t actualsize =
            roaring_bitmap_portable_serialize(r1, serializedbytes);
        assert_int_equal(actualsize, compact_size);
        roaring_bitmap_t *t =
            roaring_bitmap_portable_deserialize(serializedbytes);
        assert_true(roaring_bitmap_equals(r1, t));
        roaring_bitmap_free(t);
        free(serializedbytes);
        roaring_bitmap_free(r1);
    }
}